

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O1

void __thiscall
markdown::token::HtmlAnchorTag::HtmlAnchorTag(HtmlAnchorTag *this,string *url,string *title)

{
  size_type sVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined8 uStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  anon_unknown_0::encodeString(&local_50,url,9);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x15864f);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_e0 = *puVar5;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  sVar1 = title->_M_string_length;
  if (sVar1 == 0) {
    puVar5 = &local_120;
    plVar2 = &local_128;
    local_130 = puVar5;
  }
  else {
    anon_unknown_0::encodeString(&local_70,title,9);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x158659);
    local_b0 = &local_a0;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar2[3];
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    local_130 = &local_120;
    puVar5 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar5) {
      local_120 = *puVar5;
      uStack_118 = puVar3[3];
    }
    else {
      local_120 = *puVar5;
      local_130 = (ulong *)*puVar3;
    }
    plVar2 = puVar3 + 1;
    local_128 = puVar3[1];
    *puVar3 = puVar5;
  }
  *plVar2 = 0;
  *(undefined1 *)puVar5 = 0;
  uVar6 = 0xf;
  if (local_f0 != &local_e0) {
    uVar6 = local_e0;
  }
  if (uVar6 < (ulong)(local_128 + local_e8)) {
    uVar6 = 0xf;
    if (local_130 != &local_120) {
      uVar6 = local_120;
    }
    if ((ulong)(local_128 + local_e8) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0014dd6f;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130);
LAB_0014dd6f:
  local_110 = &local_100;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_100 = *plVar2;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *plVar2;
    local_110 = (long *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c0 = *plVar4;
    uStack_b8 = (undefined4)plVar2[3];
    uStack_b4 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (this->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_001682d0;
  (this->super_TextHolder).mText._M_dataplus._M_p = (pointer)&(this->super_TextHolder).mText.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_TextHolder).mText,local_d0,local_c8 + (long)local_d0);
  (this->super_TextHolder).mCanContainMarkup = false;
  (this->super_TextHolder).mEncodingFlags = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (sVar1 != 0) {
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_TextHolder).super_Token._vptr_Token = (_func_int **)&PTR__TextHolder_00168800;
  return;
}

Assistant:

HtmlAnchorTag::HtmlAnchorTag(const std::string& url, const std::string& title):
	TextHolder("<a href=\""+encodeString(url, cQuotes|cAmps)+"\""
		+(title.empty() ? std::string() : " title=\""+encodeString(title, cQuotes|cAmps)+"\"")
		+">", false, 0)
{
	// This space deliberately blank. ;-)
}